

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FieldDescriptorProto::FieldDescriptorProto
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  InternalMetadataWithArena *this_00;
  void *pvVar1;
  FieldOptions *from_00;
  int32 iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FieldOptions *this_01;
  Arena *pAVar6;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FieldDescriptorProto_00653760;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  this_00 = &this->_internal_metadata_;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  uVar5 = (from->_has_bits_).has_bits_[0];
  if ((uVar5 & 1) != 0) {
    pAVar6 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_,pAVar6);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->extendee_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 2) != 0) {
    pAVar6 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->extendee_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->extendee_).ptr_,pAVar6);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->type_name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 4) != 0) {
    pAVar6 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->type_name_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->type_name_).ptr_,pAVar6);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->default_value_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 8) != 0) {
    pAVar6 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->default_value_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->default_value_).ptr_,pAVar6);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  (this->json_name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar5 & 0x10) != 0) {
    pAVar6 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->json_name_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->json_name_).ptr_,pAVar6);
    uVar5 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar5 & 0x20) == 0) {
    this_01 = (FieldOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_01 = (FieldOptions *)operator_new(0x58);
    FieldOptions::FieldOptions(this_01,from_00);
  }
  this->options_ = this_01;
  iVar2 = from->oneof_index_;
  iVar3 = from->label_;
  iVar4 = from->type_;
  this->number_ = from->number_;
  this->oneof_index_ = iVar2;
  this->label_ = iVar3;
  this->type_ = iVar4;
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto(const FieldDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  extendee_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_extendee()) {
    extendee_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_extendee(),
      GetArenaNoVirtual());
  }
  type_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_type_name()) {
    type_name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_type_name(),
      GetArenaNoVirtual());
  }
  default_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_default_value()) {
    default_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_default_value(),
      GetArenaNoVirtual());
  }
  json_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_json_name()) {
    json_name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_json_name(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::FieldOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  ::memcpy(&number_, &from.number_,
    static_cast<size_t>(reinterpret_cast<char*>(&type_) -
    reinterpret_cast<char*>(&number_)) + sizeof(type_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FieldDescriptorProto)
}